

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O3

void __thiscall RandomizerWorld::~RandomizerWorld(RandomizerWorld *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppIVar2;
  WorldNode *this_00;
  pointer ppWVar3;
  WorldPath *pWVar4;
  pointer ppWVar5;
  pointer ppWVar6;
  WorldRegion *pWVar7;
  pointer puVar8;
  pointer pcVar9;
  pointer ppHVar10;
  HintSource *pHVar11;
  undefined8 *puVar12;
  pointer ppVar13;
  WorldTeleportTree *pWVar14;
  pointer ppIVar15;
  Item *pIVar16;
  pointer ppEVar17;
  _Rb_tree_node_base *p_Var18;
  type *tree_1;
  pointer ppVar19;
  pointer ppIVar20;
  WorldTeleportTree *pWVar21;
  pointer ppIVar22;
  pointer ppWVar23;
  pointer ppWVar24;
  pointer ppHVar25;
  
  ppIVar2 = (this->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar20 = (this->_item_sources).
                  super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppIVar20 != ppIVar2; ppIVar20 = ppIVar20 + 1) {
    if (*ppIVar20 != (ItemSource *)0x0) {
      (*(*ppIVar20)->_vptr_ItemSource[1])();
    }
  }
  for (p_Var18 = (this->_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var18 != &(this->_nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
    this_00 = *(WorldNode **)(p_Var18 + 2);
    if (this_00 != (WorldNode *)0x0) {
      WorldNode::~WorldNode(this_00);
    }
    operator_delete(this_00,0xa8);
  }
  ppWVar3 = (this->_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppWVar23 = (this->_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppWVar23 != ppWVar3;
      ppWVar23 = ppWVar23 + 1) {
    pWVar4 = *ppWVar23;
    if (pWVar4 != (WorldPath *)0x0) {
      ppIVar22 = (pWVar4->_items_placed_when_crossing).
                 super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      if (ppIVar22 != (pointer)0x0) {
        operator_delete(ppIVar22,(long)(pWVar4->_items_placed_when_crossing).
                                       super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage - (long)ppIVar22);
      }
      ppWVar5 = (pWVar4->_required_nodes).
                super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppWVar5 != (pointer)0x0) {
        operator_delete(ppWVar5,(long)(pWVar4->_required_nodes).
                                      super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppWVar5);
      }
      ppIVar22 = (pWVar4->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppIVar22 != (pointer)0x0) {
        operator_delete(ppIVar22,(long)(pWVar4->_required_items).
                                       super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage - (long)ppIVar22);
      }
    }
    operator_delete(pWVar4,0x60);
  }
  ppWVar6 = (this->_regions).super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppWVar24 = (this->_regions).super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppWVar24 != ppWVar6;
      ppWVar24 = ppWVar24 + 1) {
    pWVar7 = *ppWVar24;
    if (pWVar7 != (WorldRegion *)0x0) {
      puVar8 = (pWVar7->_dark_map_ids).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar8 != (pointer)0x0) {
        operator_delete(puVar8,(long)(pWVar7->_dark_map_ids).
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar8);
      }
      ppWVar5 = (pWVar7->_nodes).super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppWVar5 != (pointer)0x0) {
        operator_delete(ppWVar5,(long)(pWVar7->_nodes).
                                      super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppWVar5);
      }
      pcVar9 = (pWVar7->_hint_name)._M_dataplus._M_p;
      paVar1 = &(pWVar7->_hint_name).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar9 != paVar1) {
        operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
      }
      pcVar9 = (pWVar7->_name)._M_dataplus._M_p;
      paVar1 = &(pWVar7->_name).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar9 != paVar1) {
        operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
      }
    }
    operator_delete(pWVar7,0x78);
  }
  ppHVar10 = (this->_hint_sources).super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  for (ppHVar25 = (this->_hint_sources).
                  super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppHVar25 != ppHVar10; ppHVar25 = ppHVar25 + 1) {
    pHVar11 = *ppHVar25;
    if (pHVar11 != (HintSource *)0x0) {
      pHVar11->_vptr_HintSource = (_func_int **)&PTR_to_json_abi_cxx11__002625f8;
      puVar8 = (pHVar11->_map_ids).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar8 != (pointer)0x0) {
        operator_delete(puVar8,(long)(pHVar11->_map_ids).
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar8);
      }
      pcVar9 = (pHVar11->_text)._M_dataplus._M_p;
      paVar1 = &(pHVar11->_text).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar9 != paVar1) {
        operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
      }
      pcVar9 = (pHVar11->_description)._M_dataplus._M_p;
      paVar1 = &(pHVar11->_description).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar9 != paVar1) {
        operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
      }
      puVar8 = (pHVar11->_text_ids).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar8 != (pointer)0x0) {
        operator_delete(puVar8,(long)(pHVar11->_text_ids).
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar8);
      }
    }
    operator_delete(pHVar11,0x90);
  }
  for (p_Var18 = (this->_available_spawn_locations)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
      (_Rb_tree_header *)p_Var18 !=
      &(this->_available_spawn_locations)._M_t._M_impl.super__Rb_tree_header;
      p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
    puVar12 = *(undefined8 **)(p_Var18 + 2);
    if (puVar12 != (undefined8 *)0x0) {
      if ((long *)puVar12[5] != puVar12 + 7) {
        operator_delete((long *)puVar12[5],puVar12[7] + 1);
      }
      if ((long *)*puVar12 != puVar12 + 2) {
        operator_delete((long *)*puVar12,puVar12[2] + 1);
      }
    }
    operator_delete(puVar12,0x50);
  }
  ppVar13 = (this->_teleport_tree_pairs).
            super__Vector_base<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar19 = (this->_teleport_tree_pairs).
                 super__Vector_base<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar19 != ppVar13;
      ppVar19 = ppVar19 + 1) {
    pWVar21 = ppVar19->first;
    pWVar14 = ppVar19->second;
    if (pWVar21 != pWVar14) {
      if (pWVar14 != (WorldTeleportTree *)0x0) {
        pcVar9 = (pWVar14->_node_id)._M_dataplus._M_p;
        paVar1 = &(pWVar14->_node_id).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar9 != paVar1) {
          operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
        }
        pcVar9 = (pWVar14->_name)._M_dataplus._M_p;
        paVar1 = &(pWVar14->_name).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar9 != paVar1) {
          operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
        }
      }
      operator_delete(pWVar14,0x58);
      pWVar21 = ppVar19->first;
    }
    if (pWVar21 != (WorldTeleportTree *)0x0) {
      pcVar9 = (pWVar21->_node_id)._M_dataplus._M_p;
      paVar1 = &(pWVar21->_node_id).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar9 != paVar1) {
        operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
      }
      pcVar9 = (pWVar21->_name)._M_dataplus._M_p;
      paVar1 = &(pWVar21->_name).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar9 != paVar1) {
        operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
      }
    }
    operator_delete(pWVar21,0x58);
  }
  ppIVar22 = (this->_archipelago_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppIVar15 = (this->_archipelago_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppIVar22 != ppIVar15) {
    do {
      pIVar16 = *ppIVar22;
      if (pIVar16 != (Item *)0x0) {
        pIVar16->_vptr_Item = (_func_int **)&PTR_gold_value_00262868;
        pcVar9 = (pIVar16->_name)._M_dataplus._M_p;
        paVar1 = &(pIVar16->_name).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar9 != paVar1) {
          operator_delete(pcVar9,paVar1->_M_allocated_capacity + 1);
        }
      }
      operator_delete(pIVar16,0x40);
      ppIVar22 = ppIVar22 + 1;
    } while (ppIVar22 != ppIVar15);
    ppIVar22 = (this->_archipelago_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
  }
  if (ppIVar22 != (pointer)0x0) {
    operator_delete(ppIVar22,(long)(this->_archipelago_items).
                                   super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)ppIVar22);
  }
  ppVar19 = (this->_teleport_tree_pairs).
            super__Vector_base<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar19 != (pointer)0x0) {
    operator_delete(ppVar19,(long)(this->_teleport_tree_pairs).
                                  super__Vector_base<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>,_std::allocator<std::pair<WorldTeleportTree_*,_WorldTeleportTree_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar19
                   );
  }
  std::
  _Rb_tree<Entity_*,_std::pair<Entity_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<Entity_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<Entity_*>,_std::allocator<std::pair<Entity_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->_custom_dialogues)._M_t);
  ppEVar17 = (this->_fahl_enemies).super__Vector_base<EntityType_*,_std::allocator<EntityType_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar17 != (pointer)0x0) {
    operator_delete(ppEVar17,(long)(this->_fahl_enemies).
                                   super__Vector_base<EntityType_*,_std::allocator<EntityType_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppEVar17);
  }
  ppHVar25 = (this->_used_hint_sources).
             super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppHVar25 != (pointer)0x0) {
    operator_delete(ppHVar25,(long)(this->_used_hint_sources).
                                   super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppHVar25);
  }
  ppHVar25 = (this->_hint_sources).super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppHVar25 != (pointer)0x0) {
    operator_delete(ppHVar25,(long)(this->_hint_sources).
                                   super__Vector_base<HintSource_*,_std::allocator<HintSource_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppHVar25);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>_>
  ::~_Rb_tree(&(this->_available_spawn_locations)._M_t);
  ppWVar24 = (this->_regions).super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppWVar24 != (pointer)0x0) {
    operator_delete(ppWVar24,(long)(this->_regions).
                                   super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppWVar24);
  }
  ppWVar23 = (this->_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppWVar23 != (pointer)0x0) {
    operator_delete(ppWVar23,(long)(this->_paths).
                                   super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppWVar23);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
  ::~_Rb_tree(&(this->_nodes)._M_t);
  ppIVar20 = (this->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppIVar20 != (pointer)0x0) {
    operator_delete(ppIVar20,(long)(this->_item_sources).
                                   super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppIVar20);
  }
  World::~World(&this->super_World);
  return;
}

Assistant:

RandomizerWorld::~RandomizerWorld()
{
    for (ItemSource* source : _item_sources)
        delete source;
    for (auto& [key, node] : _nodes)
        delete node;
    for (WorldPath* path : _paths)
        delete path;
    for (WorldRegion* region : _regions)
        delete region;
    for (HintSource* hint_source : _hint_sources)
        delete hint_source;
    for (auto& [key, spawn_loc] : _available_spawn_locations)
        delete spawn_loc;
    for (auto& [tree_1, tree_2] : _teleport_tree_pairs)
    {
        if(tree_1 != tree_2)
            delete tree_2;
        delete tree_1;
    }
    for(Item* item : _archipelago_items)
        delete item;
}